

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::anon_unknown_0::DescriptorDatabaseTest_FindAllExtensionNumbers_Test::TestBody
          (DescriptorDatabaseTest_FindAllExtensionNumbers_Test *this)

{
  DescriptorDatabase *pDVar1;
  long lVar2;
  string sVar3;
  int *piVar4;
  int *piVar5;
  int iVar6;
  ulong uVar7;
  pointer *__ptr;
  char *pcVar8;
  char *in_R9;
  pointer *__ptr_1;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  vector<int,_std::allocator<int>_> numbers;
  AssertHelper local_88;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  undefined1 local_70 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  AssertHelper local_50;
  int *local_48;
  int *piStack_40;
  long local_38;
  
  DescriptorDatabaseTest::AddToDatabase
            (&this->super_DescriptorDatabaseTest,
             "name: \"foo.proto\" message_type {   name: \"Foo\"   extension_range { start: 1 end: 1000 }   extension { name:\"qux\" label:LABEL_OPTIONAL type:TYPE_INT32 number:5               extendee: \".Foo\" }}"
            );
  DescriptorDatabaseTest::AddToDatabase
            (&this->super_DescriptorDatabaseTest,
             "name: \"bar.proto\" package: \"corge\" dependency: \"foo.proto\" message_type {   name: \"Bar\"   extension_range { start: 1 end: 1000 } } extension { name:\"grault\" extendee: \".Foo\"       number:32 } extension { name:\"garply\" extendee: \".corge.Bar\" number:70 } extension { name:\"waldo\"  extendee: \"Bar\"        number:56 } "
            );
  local_48 = (int *)0x0;
  piStack_40 = (int *)0x0;
  local_38 = 0;
  pDVar1 = (this->super_DescriptorDatabaseTest).database_;
  local_70 = (undefined1  [8])&local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"Foo","");
  iVar6 = (*pDVar1->_vptr_DescriptorDatabase[5])(pDVar1,local_70,&local_48);
  local_80._M_head_impl._0_1_ = (internal)(char)iVar6;
  local_78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_70 != (undefined1  [8])&local_60) {
    operator_delete((void *)local_70,local_60._M_allocated_capacity + 1);
  }
  if (local_80._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_70,(internal *)&local_80,
               (AssertionResult *)"database_->FindAllExtensionNumbers(\"Foo\", &numbers)","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
               ,0x17f,(char *)local_70);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if (local_70 != (undefined1  [8])&local_60) {
      operator_delete((void *)local_70,local_60._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_88.data_._4_4_,local_88.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_88.data_._4_4_,local_88.data_._0_4_) + 8))();
    }
  }
  if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_78,local_78);
  }
  local_88.data_._0_4_ = 2;
  local_80._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((long)piStack_40 - (long)local_48 >> 2);
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)local_70,"2","numbers.size()",(int *)&local_88,(unsigned_long *)&local_80);
  sVar3 = local_70[0];
  if (local_70[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_80);
    if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar8 = (local_68->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
               ,0x180,pcVar8);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_80);
LAB_0054916f:
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    if (local_80._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_80._M_head_impl + 8))();
    }
  }
  else {
    if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_68,local_68);
    }
    piVar5 = piStack_40;
    piVar4 = local_48;
    if (local_48 != piStack_40) {
      uVar7 = (long)piStack_40 - (long)local_48 >> 2;
      lVar2 = 0x3f;
      if (uVar7 != 0) {
        for (; uVar7 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (local_48,piStack_40,((uint)lVar2 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (piVar4,piVar5);
    }
    local_80._M_head_impl._0_4_ = 5;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_70,"5","numbers[0]",(int *)&local_80,local_48);
    if (local_70[0] == (string)0x0) {
      testing::Message::Message((Message *)&local_80);
      if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar8 = anon_var_dwarf_a12c75 + 5;
      }
      else {
        pcVar8 = (local_68->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_88,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
                 ,0x182,pcVar8);
      testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_80);
      testing::internal::AssertHelper::~AssertHelper(&local_88);
      if (local_80._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_80._M_head_impl + 8))();
      }
    }
    if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_68,local_68);
    }
    local_80._M_head_impl._0_4_ = 0x20;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_70,"32","numbers[1]",(int *)&local_80,local_48 + 1);
    if (local_70[0] == (string)0x0) {
      testing::Message::Message((Message *)&local_80);
      if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar8 = anon_var_dwarf_a12c75 + 5;
      }
      else {
        pcVar8 = (local_68->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_88,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
                 ,0x183,pcVar8);
      testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_80);
      goto LAB_0054916f;
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  if (local_48 != (int *)0x0) {
    operator_delete(local_48,local_38 - (long)local_48);
  }
  if (sVar3 == (string)0x0) {
    return;
  }
  local_48 = (int *)0x0;
  piStack_40 = (int *)0x0;
  local_38 = 0;
  pDVar1 = (this->super_DescriptorDatabaseTest).database_;
  local_70 = (undefined1  [8])&local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"corge.Bar","");
  iVar6 = (*pDVar1->_vptr_DescriptorDatabase[5])(pDVar1,local_70,&local_48);
  local_80._M_head_impl._0_1_ = (internal)(char)iVar6;
  local_78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_70 != (undefined1  [8])&local_60) {
    operator_delete((void *)local_70,local_60._M_allocated_capacity + 1);
  }
  if (local_80._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_70,(internal *)&local_80,
               (AssertionResult *)"database_->FindAllExtensionNumbers(\"corge.Bar\", &numbers)",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
               ,0x188,(char *)local_70);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if (local_70 != (undefined1  [8])&local_60) {
      operator_delete((void *)local_70,local_60._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_88.data_._4_4_,local_88.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_88.data_._4_4_,local_88.data_._0_4_) + 8))();
    }
  }
  if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_78,local_78);
  }
  local_88.data_._0_4_ = 1;
  local_80._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((long)piStack_40 - (long)local_48 >> 2);
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)local_70,"1","numbers.size()",(int *)&local_88,(unsigned_long *)&local_80);
  sVar3 = local_70[0];
  if (local_70[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_80);
    if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar8 = (local_68->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
               ,0x18a,pcVar8);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_80);
  }
  else {
    if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_68,local_68);
    }
    local_80._M_head_impl._0_4_ = 0x46;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_70,"70","numbers[0]",(int *)&local_80,local_48);
    if (local_70[0] != (string)0x0) goto LAB_005493fb;
    testing::Message::Message((Message *)&local_80);
    if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar8 = (local_68->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
               ,0x18b,pcVar8);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_80);
  }
  testing::internal::AssertHelper::~AssertHelper(&local_88);
  if (local_80._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_80._M_head_impl + 8))();
  }
LAB_005493fb:
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  if (local_48 != (int *)0x0) {
    operator_delete(local_48,local_38 - (long)local_48);
  }
  if (sVar3 != (string)0x0) {
    local_48 = (int *)0x0;
    piStack_40 = (int *)0x0;
    local_38 = 0;
    pDVar1 = (this->super_DescriptorDatabaseTest).database_;
    local_70 = (undefined1  [8])&local_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"NoSuchType","");
    iVar6 = (*pDVar1->_vptr_DescriptorDatabase[5])(pDVar1,local_70,&local_48);
    local_80._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (CONCAT71(local_80._M_head_impl._1_7_,(char)iVar6) ^ 1);
    local_78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (local_70 != (undefined1  [8])&local_60) {
      operator_delete((void *)local_70,local_60._M_allocated_capacity + 1);
    }
    if (local_80._M_head_impl._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_88);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_70,(internal *)&local_80,
                 (AssertionResult *)"database_->FindAllExtensionNumbers(\"NoSuchType\", &numbers)",
                 "true","false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_50,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
                 ,0x191,(char *)local_70);
      testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_88);
      testing::internal::AssertHelper::~AssertHelper(&local_50);
      if (local_70 != (undefined1  [8])&local_60) {
        operator_delete((void *)local_70,local_60._M_allocated_capacity + 1);
      }
      if ((long *)CONCAT44(local_88.data_._4_4_,local_88.data_._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_88.data_._4_4_,local_88.data_._0_4_) + 8))();
      }
    }
    if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_78,local_78);
    }
    if (local_48 != (int *)0x0) {
      operator_delete(local_48,local_38 - (long)local_48);
    }
    local_48 = (int *)0x0;
    piStack_40 = (int *)0x0;
    local_38 = 0;
    pDVar1 = (this->super_DescriptorDatabaseTest).database_;
    local_70 = (undefined1  [8])&local_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"Bar","");
    iVar6 = (*pDVar1->_vptr_DescriptorDatabase[5])(pDVar1,local_70,&local_48);
    local_80._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (CONCAT71(local_80._M_head_impl._1_7_,(char)iVar6) ^ 1);
    local_78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (local_70 != (undefined1  [8])&local_60) {
      operator_delete((void *)local_70,local_60._M_allocated_capacity + 1);
    }
    if (local_80._M_head_impl._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_88);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_70,(internal *)&local_80,
                 (AssertionResult *)"database_->FindAllExtensionNumbers(\"Bar\", &numbers)","true",
                 "false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_50,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
                 ,0x197,(char *)local_70);
      testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_88);
      testing::internal::AssertHelper::~AssertHelper(&local_50);
      if (local_70 != (undefined1  [8])&local_60) {
        operator_delete((void *)local_70,local_60._M_allocated_capacity + 1);
      }
      if ((long *)CONCAT44(local_88.data_._4_4_,local_88.data_._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_88.data_._4_4_,local_88.data_._0_4_) + 8))();
      }
    }
    if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_78,local_78);
    }
    if (local_48 != (int *)0x0) {
      operator_delete(local_48,local_38 - (long)local_48);
    }
  }
  return;
}

Assistant:

TEST_P(DescriptorDatabaseTest, FindAllExtensionNumbers) {
  AddToDatabase(
      "name: \"foo.proto\" "
      "message_type { "
      "  name: \"Foo\" "
      "  extension_range { start: 1 end: 1000 } "
      "  extension { name:\"qux\" label:LABEL_OPTIONAL type:TYPE_INT32 "
      "number:5 "
      "              extendee: \".Foo\" }"
      "}");
  AddToDatabase(
      "name: \"bar.proto\" "
      "package: \"corge\" "
      "dependency: \"foo.proto\" "
      "message_type { "
      "  name: \"Bar\" "
      "  extension_range { start: 1 end: 1000 } "
      "} "
      "extension { name:\"grault\" extendee: \".Foo\"       number:32 } "
      "extension { name:\"garply\" extendee: \".corge.Bar\" number:70 } "
      "extension { name:\"waldo\"  extendee: \"Bar\"        number:56 } ");

  {
    std::vector<int> numbers;
    EXPECT_TRUE(database_->FindAllExtensionNumbers("Foo", &numbers));
    ASSERT_EQ(2, numbers.size());
    std::sort(numbers.begin(), numbers.end());
    EXPECT_EQ(5, numbers[0]);
    EXPECT_EQ(32, numbers[1]);
  }

  {
    std::vector<int> numbers;
    EXPECT_TRUE(database_->FindAllExtensionNumbers("corge.Bar", &numbers));
    // Note: won't find extension 56 due to the name not being fully qualified.
    ASSERT_EQ(1, numbers.size());
    EXPECT_EQ(70, numbers[0]);
  }

  {
    // Can't find extensions for non-existent types.
    std::vector<int> numbers;
    EXPECT_FALSE(database_->FindAllExtensionNumbers("NoSuchType", &numbers));
  }

  {
    // Can't find extensions for unqualified types.
    std::vector<int> numbers;
    EXPECT_FALSE(database_->FindAllExtensionNumbers("Bar", &numbers));
  }
}